

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O0

void __thiscall MDIOAnalyzer::AddArrowMarkers(MDIOAnalyzer *this)

{
  value_type vVar1;
  size_type sVar2;
  element_type *peVar3;
  reference pvVar4;
  uint local_18;
  uint local_14;
  U32 i_1;
  U32 i;
  MDIOAnalyzer *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                      (&this->mMdcPosedgeArrows);
    if (sVar2 <= local_14) break;
    peVar3 = std::auto_ptr<MDIOAnalyzerResults>::operator->(&this->mResults);
    pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&this->mMdcPosedgeArrows,(ulong)local_14);
    vVar1 = *pvVar4;
    std::auto_ptr<MDIOAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar3,(MarkerType)vVar1,(Channel *)0x4);
    local_14 = local_14 + 1;
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::clear
            (&this->mMdcPosedgeArrows);
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                      (&this->mMdcNegedgeArrows);
    if (sVar2 <= local_18) break;
    peVar3 = std::auto_ptr<MDIOAnalyzerResults>::operator->(&this->mResults);
    pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&this->mMdcNegedgeArrows,(ulong)local_18);
    vVar1 = *pvVar4;
    std::auto_ptr<MDIOAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar3,(MarkerType)vVar1,(Channel *)0x5);
    local_18 = local_18 + 1;
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::clear
            (&this->mMdcNegedgeArrows);
  return;
}

Assistant:

void MDIOAnalyzer::AddArrowMarkers()
{
    // add arrows in clock posedges
    for( U32 i = 0; i < mMdcPosedgeArrows.size(); i++ )
    {
        mResults->AddMarker( mMdcPosedgeArrows[ i ], AnalyzerResults::UpArrow, mSettings->mMdcChannel );
    }
    mMdcPosedgeArrows.clear();

    // add arrows in clock negedges
    for( U32 i = 0; i < mMdcNegedgeArrows.size(); i++ )
    {
        mResults->AddMarker( mMdcNegedgeArrows[ i ], AnalyzerResults::DownArrow, mSettings->mMdcChannel );
    }
    mMdcNegedgeArrows.clear();
}